

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::interpreter::impl::force_global_scope::force_global_scope(force_global_scope *this,impl *i)

{
  gc_heap_ptr_untyped gStack_48;
  gc_heap_ptr_untyped local_38;
  gc_heap_ptr_untyped local_28;
  
  this->parent_ = i;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            (&(this->old_scope_).super_gc_heap_ptr_untyped,
             &(i->active_scope_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&gStack_48,&(i->global_).super_gc_heap_ptr_untyped);
  local_28.heap_ = (gc_heap *)0x0;
  local_28.pos_ = 0;
  make_scope((object_ptr *)&local_38,(scope_ptr *)&gStack_48);
  gc_heap_ptr_untyped::operator=
            (&(this->parent_->active_scope_).super_gc_heap_ptr_untyped,&local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_28);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_48);
  return;
}

Assistant:

explicit force_global_scope(impl& i) : parent_(i), old_scope_(parent_.active_scope_) {
            parent_.active_scope_ = make_scope(i.global_, nullptr);
        }